

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int cmfgkb_(int *lot,int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *im1,
           int *in1,double *ch,double *ch1,int *im2,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  int local_17c;
  ulong local_118;
  int local_bc;
  int local_b8;
  int local_b0;
  int local_ac;
  ulong local_a0;
  int local_88;
  
  iVar19 = *ido;
  lVar36 = (long)iVar19;
  uVar4 = *ip;
  uVar21 = ~(uVar4 * iVar19);
  iVar5 = *in1;
  iVar6 = *lid;
  uVar48 = iVar6 + 1;
  uVar37 = (ulong)uVar48;
  iVar11 = iVar5 * 2;
  iVar40 = -3 - iVar11 * uVar48;
  iVar7 = *in2;
  iVar41 = uVar48 * iVar7;
  iVar33 = iVar41 * -2 + -3;
  iVar8 = *l1;
  iVar9 = *im1;
  lVar20 = (long)iVar9;
  lVar44 = ((long)*lot + -1) * lVar20;
  iVar32 = *im2;
  uVar14 = uVar4 + 1;
  iVar10 = (int)lVar44;
  lVar18 = (long)(iVar10 + 1);
  if (0 < iVar6) {
    bVar13 = -1 < iVar10;
    if (iVar9 < 0) {
      bVar13 = iVar10 < 1;
    }
    iVar22 = iVar5 * uVar48 * 2 + 2;
    iVar42 = iVar41 * 2 + 2;
    uVar29 = 1;
    do {
      lVar52 = lVar20 + 1;
      iVar45 = iVar22;
      iVar49 = iVar42;
      if (bVar13) {
        do {
          ch1[(long)iVar33 + (long)(iVar49 + 1)] = cc1[(long)iVar40 + (long)(iVar45 + 1)];
          ch1[(long)iVar33 + (long)iVar49 + 2] = cc1[(long)iVar40 + (long)iVar45 + 2];
          bVar12 = lVar52 <= lVar18;
          if (iVar9 < 0) {
            bVar12 = lVar44 < lVar52;
          }
          iVar45 = iVar45 + iVar9 * 2;
          lVar52 = lVar52 + lVar20;
          iVar49 = iVar49 + iVar32 * 2;
        } while (bVar12);
      }
      uVar29 = uVar29 + 1;
      iVar22 = iVar22 + iVar11;
      iVar42 = iVar42 + iVar7 * 2;
    } while (uVar29 != uVar37);
  }
  uVar15 = uVar4 - 1;
  iVar22 = (int)((uVar4 - ((int)uVar14 >> 0x1f)) + 1) >> 1;
  if (2 < (int)uVar4) {
    bVar13 = -1 < iVar10;
    if (iVar9 < 0) {
      bVar13 = iVar10 < 1;
    }
    lVar44 = (long)iVar10;
    iVar42 = 2;
    if (2 < iVar22) {
      iVar42 = iVar22;
    }
    iVar16 = iVar6 * 2 + 1;
    iVar49 = iVar5 * iVar16 * 2;
    iVar23 = iVar5 * iVar6;
    iVar39 = iVar23 * 2;
    iVar45 = uVar4 * iVar6 + 1;
    iVar17 = iVar5 * iVar45 * 2;
    iVar45 = iVar45 * iVar7 * 2 + 2;
    iVar24 = iVar7 * iVar6;
    iVar50 = iVar24 * 2;
    iVar43 = iVar7 * 2;
    iVar28 = iVar32 * 2;
    local_17c = iVar16 * iVar7 * 2 + 2;
    uVar29 = 2;
    do {
      if (0 < iVar6) {
        uVar25 = 1;
        iVar35 = local_17c;
        iVar30 = iVar17;
        iVar34 = iVar49;
        iVar16 = iVar45;
        do {
          if (bVar13) {
            iVar38 = 0;
            lVar52 = lVar20 + 1;
            iVar27 = iVar35;
            iVar51 = iVar16;
            do {
              lVar26 = (long)(iVar34 + iVar38 + 3);
              lVar47 = (long)(iVar30 + 3 + iVar38);
              ch1[(long)iVar33 + (long)(iVar27 + 1)] = cc1[iVar40 + lVar26] + cc1[iVar40 + lVar47];
              ch1[(long)iVar33 + (long)(iVar51 + 1)] = cc1[iVar40 + lVar26] - cc1[iVar40 + lVar47];
              lVar47 = (long)(iVar34 + 2 + iVar38);
              lVar26 = (long)(iVar30 + 2 + iVar38);
              ch1[(long)iVar33 + (long)iVar27 + 2] =
                   cc1[(long)iVar40 + lVar47 + 2] + cc1[(long)iVar40 + lVar26 + 2];
              bVar12 = lVar52 <= lVar18;
              if (iVar9 < 0) {
                bVar12 = lVar44 < lVar52;
              }
              ch1[(long)iVar33 + (long)iVar51 + 2] =
                   cc1[(long)iVar40 + lVar47 + 2] - cc1[(long)iVar40 + lVar26 + 2];
              iVar38 = iVar38 + iVar9 * 2;
              lVar52 = lVar52 + lVar20;
              iVar51 = iVar51 + iVar28;
              iVar27 = iVar27 + iVar28;
            } while (bVar12);
          }
          uVar25 = uVar25 + 1;
          iVar34 = iVar34 + iVar11;
          iVar30 = iVar30 + iVar11;
          iVar16 = iVar16 + iVar43;
          iVar35 = iVar35 + iVar43;
        } while (uVar25 != uVar37);
      }
      uVar29 = uVar29 + 1;
      iVar49 = iVar49 + iVar39;
      iVar17 = iVar17 + iVar23 * -2;
      iVar45 = iVar45 + iVar24 * -2;
      local_17c = local_17c + iVar50;
    } while (uVar29 != iVar42 + 1);
    if (2 < (int)uVar4) {
      bVar13 = -1 < iVar10;
      if (iVar9 < 0) {
        bVar13 = iVar10 < 1;
      }
      iVar42 = 2;
      if (2 < iVar22) {
        iVar42 = iVar22;
      }
      iVar45 = (iVar6 * 2 + 1) * iVar7 * 2 + 2;
      uVar29 = 2;
      do {
        if (0 < iVar6) {
          uVar25 = 1;
          iVar49 = iVar5 * uVar48 * 2 + 2;
          iVar17 = iVar45;
          do {
            lVar52 = lVar20 + 1;
            iVar35 = iVar17;
            iVar16 = iVar49;
            if (bVar13) {
              do {
                cc1[(long)iVar40 + (long)(iVar16 + 1)] =
                     ch1[(long)iVar33 + (long)(iVar35 + 1)] + cc1[(long)iVar40 + (long)(iVar16 + 1)]
                ;
                cc1[(long)iVar40 + (long)iVar16 + 2] =
                     ch1[(long)iVar33 + (long)iVar35 + 2] + cc1[(long)iVar40 + (long)iVar16 + 2];
                bVar12 = lVar52 <= lVar18;
                if (iVar9 < 0) {
                  bVar12 = lVar44 < lVar52;
                }
                lVar52 = lVar52 + lVar20;
                iVar35 = iVar35 + iVar28;
                iVar16 = iVar16 + iVar9 * 2;
              } while (bVar12);
            }
            uVar25 = uVar25 + 1;
            iVar49 = iVar49 + iVar11;
            iVar17 = iVar17 + iVar43;
          } while (uVar25 != uVar37);
        }
        uVar29 = uVar29 + 1;
        iVar45 = iVar45 + iVar50;
      } while (uVar29 != iVar42 + 1);
      if (2 < (int)uVar4) {
        bVar13 = -1 < iVar10;
        if (iVar9 < 0) {
          bVar13 = iVar10 < 1;
        }
        iVar42 = 3;
        if (3 < iVar22) {
          iVar42 = iVar22;
        }
        iVar45 = 2;
        if (2 < iVar22) {
          iVar45 = iVar22;
        }
        iVar17 = iVar6 * 2 + 1;
        local_ac = iVar5 * iVar17;
        local_b8 = local_ac * 2 + 2;
        local_ac = local_ac * 2;
        iVar49 = iVar6 * uVar4 + 1;
        local_b0 = iVar5 * iVar49;
        local_bc = local_b0 * 2 + 2;
        local_b0 = local_b0 * 2;
        iVar49 = iVar49 * iVar7 * 2;
        iVar17 = iVar17 * iVar7 * 2;
        iVar16 = iVar9 * 2;
        local_a0 = 2;
        do {
          if (0 < iVar6) {
            lVar52 = (uVar15 + local_a0 + -1) * lVar36;
            lVar26 = ((long)(int)(uVar15 * 2) + local_a0 + -1) * lVar36;
            uVar29 = 1;
            iVar34 = 0;
            iVar30 = local_bc;
            iVar35 = local_b8;
            do {
              lVar47 = lVar20 + 1;
              iVar27 = iVar30;
              iVar51 = iVar35;
              iVar38 = iVar34;
              if (bVar13) {
                do {
                  cc1[(long)iVar40 + (long)(iVar51 + 1)] =
                       wa[(long)(int)uVar21 + lVar52 + 1] *
                       ch1[(long)iVar33 + (long)(iVar17 + 3 + iVar38)] +
                       ch1[(long)iVar33 + (long)(iVar38 + iVar41 * 2 + 3)];
                  cc1[(long)iVar40 + (long)(iVar27 + 1)] =
                       wa[(long)(int)uVar21 + lVar26 + 1] *
                       ch1[(long)iVar33 + (long)(iVar49 + 3 + iVar38)];
                  cc1[(long)iVar40 + (long)iVar51 + 2] =
                       wa[(long)(int)uVar21 + lVar52 + 1] *
                       ch1[(long)iVar33 + (long)(iVar17 + 2 + iVar38) + 2] +
                       ch1[(long)iVar33 + (long)(iVar41 * 2 + 2 + iVar38) + 2];
                  bVar12 = lVar47 <= lVar18;
                  if (iVar9 < 0) {
                    bVar12 = lVar44 < lVar47;
                  }
                  cc1[(long)iVar40 + (long)iVar27 + 2] =
                       wa[(long)(int)uVar21 + lVar26 + 1] *
                       ch1[(long)iVar33 + (long)(iVar49 + 2 + iVar38) + 2];
                  lVar47 = lVar47 + lVar20;
                  iVar27 = iVar27 + iVar16;
                  iVar51 = iVar51 + iVar16;
                  iVar38 = iVar38 + iVar28;
                } while (bVar12);
              }
              uVar29 = uVar29 + 1;
              iVar35 = iVar35 + iVar11;
              iVar30 = iVar30 + iVar11;
              iVar34 = iVar34 + iVar43;
            } while (uVar29 != uVar37);
          }
          if (4 < uVar4) {
            local_88 = (int)local_a0 + -1;
            uVar29 = 3;
            local_17c = (iVar6 * uVar15 + 1) * iVar7 * 2 + 2;
            iVar35 = (iVar6 * 3 + 1) * iVar7 * 2 + 2;
            do {
              iVar30 = (((int)uVar29 + -1) * local_88) % (int)uVar4;
              if (0 < iVar6) {
                dVar1 = wa[(long)(int)uVar21 + (long)(int)((uVar15 + iVar30) * iVar19) + 1];
                dVar2 = wa[(long)(int)uVar21 + (long)(int)((iVar30 + uVar15 * 2) * iVar19) + 1];
                uVar25 = 1;
                iVar27 = local_ac;
                iVar51 = local_b0;
                iVar30 = local_17c;
                iVar34 = iVar35;
                do {
                  if (bVar13) {
                    iVar31 = 0;
                    lVar52 = lVar20 + 1;
                    iVar38 = iVar34;
                    iVar46 = iVar30;
                    do {
                      lVar26 = (long)(iVar27 + iVar31 + 3);
                      cc1[iVar40 + lVar26] =
                           ch1[(long)iVar33 + (long)(iVar38 + 1)] * dVar1 + cc1[iVar40 + lVar26];
                      lVar26 = (long)(iVar51 + 3 + iVar31);
                      cc1[iVar40 + lVar26] =
                           ch1[(long)iVar33 + (long)(iVar46 + 1)] * dVar2 + cc1[iVar40 + lVar26];
                      lVar26 = (long)(iVar27 + 2 + iVar31);
                      cc1[(long)iVar40 + lVar26 + 2] =
                           ch1[(long)iVar33 + (long)iVar38 + 2] * dVar1 +
                           cc1[(long)iVar40 + lVar26 + 2];
                      lVar26 = (long)(iVar51 + 2 + iVar31);
                      cc1[(long)iVar40 + lVar26 + 2] =
                           ch1[(long)iVar33 + (long)iVar46 + 2] * dVar2 +
                           cc1[(long)iVar40 + lVar26 + 2];
                      bVar12 = lVar52 <= lVar18;
                      if (iVar9 < 0) {
                        bVar12 = lVar44 < lVar52;
                      }
                      iVar31 = iVar31 + iVar16;
                      lVar52 = lVar52 + lVar20;
                      iVar46 = iVar46 + iVar28;
                      iVar38 = iVar38 + iVar28;
                    } while (bVar12);
                  }
                  uVar25 = uVar25 + 1;
                  iVar27 = iVar27 + iVar11;
                  iVar51 = iVar51 + iVar11;
                  iVar30 = iVar30 + iVar43;
                  iVar34 = iVar34 + iVar43;
                } while (uVar25 != uVar37);
              }
              uVar29 = uVar29 + 1;
              local_17c = local_17c + iVar24 * -2;
              iVar35 = iVar35 + iVar50;
            } while (uVar29 != iVar42 + 1);
          }
          local_a0 = local_a0 + 1;
          local_b8 = local_b8 + iVar39;
          local_bc = local_bc + iVar23 * -2;
          local_ac = local_ac + iVar39;
          local_b0 = local_b0 + iVar23 * -2;
        } while (local_a0 != iVar45 + 1);
      }
    }
  }
  if ((iVar19 < 2) && (*na != 1)) {
    if (2 < (int)uVar4) {
      bVar13 = -1 < iVar10;
      if (iVar9 < 0) {
        bVar13 = iVar10 < 1;
      }
      iVar19 = 2;
      if (2 < iVar22) {
        iVar19 = iVar22;
      }
      iVar7 = (iVar6 * 2 + 1) * iVar5 * 2 + 2;
      iVar8 = (uVar4 * iVar6 + 1) * iVar5 * 2 + 3;
      uVar29 = 2;
      do {
        if (0 < iVar6) {
          uVar25 = 1;
          iVar32 = iVar8;
          iVar33 = iVar7;
          do {
            lVar36 = lVar20 + 1;
            iVar41 = iVar32;
            iVar22 = iVar33;
            if (bVar13) {
              do {
                dVar1 = cc1[(long)iVar40 + (long)(iVar22 + 1)];
                dVar2 = cc1[(long)iVar40 + (long)(iVar41 + -1) + 2];
                cc1[(long)iVar40 + (long)(iVar22 + 1)] = dVar1 - dVar2;
                lVar44 = (long)iVar22;
                dVar3 = cc1[(long)iVar40 + (long)iVar41];
                cc1[(long)iVar40 + (long)(iVar41 + -1) + 2] = cc1[(long)iVar40 + lVar44 + 2] - dVar3
                ;
                cc1[(long)iVar40 + lVar44 + 2] = dVar3 + cc1[(long)iVar40 + lVar44 + 2];
                cc1[(long)iVar40 + (long)iVar41] = dVar1 + dVar2;
                bVar12 = lVar36 <= lVar18;
                if (iVar9 < 0) {
                  bVar12 = iVar10 < lVar36;
                }
                lVar36 = lVar36 + lVar20;
                iVar41 = iVar41 + iVar9 * 2;
                iVar22 = iVar22 + iVar9 * 2;
              } while (bVar12);
            }
            uVar25 = uVar25 + 1;
            iVar33 = iVar33 + iVar11;
            iVar32 = iVar32 + iVar11;
          } while (uVar25 != uVar37);
        }
        uVar29 = uVar29 + 1;
        iVar7 = iVar7 + iVar5 * iVar6 * 2;
        iVar8 = iVar8 + iVar5 * iVar6 * -2;
      } while (uVar29 != iVar19 + 1);
    }
  }
  else {
    if (0 < iVar6) {
      bVar13 = -1 < iVar10;
      if (iVar9 < 0) {
        bVar13 = iVar10 < 1;
      }
      iVar42 = uVar48 * iVar5 * 2 + 2;
      iVar41 = iVar41 * 2 + 2;
      uVar29 = 1;
      do {
        lVar44 = lVar20 + 1;
        iVar49 = iVar41;
        iVar45 = iVar42;
        if (bVar13) {
          do {
            ch1[(long)iVar33 + (long)(iVar49 + 1)] = cc1[(long)iVar40 + (long)(iVar45 + 1)];
            ch1[(long)iVar33 + (long)iVar49 + 2] = cc1[(long)iVar40 + (long)iVar45 + 2];
            bVar12 = lVar44 <= lVar18;
            if (iVar9 < 0) {
              bVar12 = iVar10 < lVar44;
            }
            iVar45 = iVar45 + iVar9 * 2;
            lVar44 = lVar44 + lVar20;
            iVar49 = iVar49 + iVar32 * 2;
          } while (bVar12);
        }
        uVar29 = uVar29 + 1;
        iVar42 = iVar42 + iVar11;
        iVar41 = iVar41 + iVar7 * 2;
      } while (uVar29 != uVar37);
    }
    if (2 < (int)uVar4) {
      bVar13 = -1 < iVar10;
      if (iVar9 < 0) {
        bVar13 = iVar10 < 1;
      }
      iVar41 = 2;
      if (2 < iVar22) {
        iVar41 = iVar22;
      }
      iVar42 = iVar6 * 2 + 1;
      iVar45 = iVar5 * iVar42 * 2;
      iVar22 = uVar4 * iVar6 + 1;
      iVar49 = iVar5 * iVar22 * 2;
      iVar22 = iVar22 * iVar7 * 2 + 2;
      iVar42 = iVar42 * iVar7 * 2 + 2;
      uVar29 = 2;
      do {
        if (0 < iVar6) {
          uVar25 = 1;
          iVar50 = iVar45;
          iVar43 = iVar49;
          iVar17 = iVar22;
          iVar39 = iVar42;
          do {
            if (bVar13) {
              iVar23 = 0;
              lVar44 = lVar20 + 1;
              iVar28 = iVar39;
              iVar16 = iVar17;
              do {
                lVar52 = (long)(iVar50 + iVar23 + 3);
                lVar26 = (long)(iVar43 + 2 + iVar23);
                ch1[(long)iVar33 + (long)(iVar28 + 1)] =
                     cc1[iVar40 + lVar52] - cc1[(long)iVar40 + lVar26 + 2];
                ch1[(long)iVar33 + (long)(iVar16 + 1)] =
                     cc1[iVar40 + lVar52] + cc1[(long)iVar40 + lVar26 + 2];
                lVar52 = (long)(iVar50 + 2 + iVar23);
                lVar26 = (long)(iVar43 + 3 + iVar23);
                ch1[(long)iVar33 + (long)iVar16 + 2] =
                     cc1[(long)iVar40 + lVar52 + 2] - cc1[iVar40 + lVar26];
                bVar12 = lVar44 <= lVar18;
                if (iVar9 < 0) {
                  bVar12 = iVar10 < lVar44;
                }
                ch1[(long)iVar33 + (long)iVar28 + 2] =
                     cc1[(long)iVar40 + lVar52 + 2] + cc1[iVar40 + lVar26];
                iVar23 = iVar23 + iVar9 * 2;
                lVar44 = lVar44 + lVar20;
                iVar16 = iVar16 + iVar32 * 2;
                iVar28 = iVar28 + iVar32 * 2;
              } while (bVar12);
            }
            uVar25 = uVar25 + 1;
            iVar50 = iVar50 + iVar11;
            iVar43 = iVar43 + iVar11;
            iVar17 = iVar17 + iVar7 * 2;
            iVar39 = iVar39 + iVar7 * 2;
          } while (uVar25 != uVar37);
        }
        uVar29 = uVar29 + 1;
        iVar45 = iVar45 + iVar5 * iVar6 * 2;
        iVar49 = iVar49 + iVar5 * iVar6 * -2;
        iVar22 = iVar22 + iVar7 * iVar6 * -2;
        iVar42 = iVar42 + iVar7 * iVar6 * 2;
      } while (uVar29 != iVar41 + 1);
    }
    if (iVar19 != 1) {
      uVar48 = iVar19 + 1;
      iVar33 = ~(iVar8 * uVar14) * iVar11 + -3;
      iVar6 = ~(iVar8 * uVar48) * iVar7 * 2 + -3;
      if (0 < iVar19) {
        bVar13 = -1 < iVar10;
        if (iVar9 < 0) {
          bVar13 = iVar10 < 1;
        }
        iVar40 = (iVar8 * uVar14 + 1) * iVar5 * 2 + 2;
        iVar41 = (iVar8 * uVar48 + 1) * iVar7 * 2 + 2;
        uVar37 = 1;
        do {
          if (0 < iVar8) {
            uVar29 = 1;
            iVar22 = iVar40;
            iVar42 = iVar41;
            do {
              lVar44 = lVar20 + 1;
              iVar45 = iVar42;
              iVar49 = iVar22;
              if (bVar13) {
                do {
                  cc[(long)iVar33 + (long)(iVar49 + 1)] = ch[(long)iVar6 + (long)(iVar45 + 1)];
                  cc[(long)iVar33 + (long)iVar49 + 2] = ch[(long)iVar6 + (long)iVar45 + 2];
                  bVar12 = lVar44 <= lVar18;
                  if (iVar9 < 0) {
                    bVar12 = iVar10 < lVar44;
                  }
                  lVar44 = lVar44 + lVar20;
                  iVar45 = iVar45 + iVar32 * 2;
                  iVar49 = iVar49 + iVar9 * 2;
                } while (bVar12);
              }
              uVar29 = uVar29 + 1;
              iVar22 = iVar22 + iVar11;
              iVar42 = iVar42 + iVar7 * 2;
            } while (uVar29 != iVar8 + 1);
          }
          uVar37 = uVar37 + 1;
          iVar40 = iVar40 + iVar5 * iVar8 * uVar4 * 2;
          iVar41 = iVar41 + iVar7 * iVar8 * 2;
        } while (uVar37 != uVar48);
      }
      if (1 < (int)uVar4) {
        bVar13 = -1 < iVar10;
        if (iVar9 < 0) {
          bVar13 = iVar10 < 1;
        }
        iVar40 = ((uVar4 + 2) * iVar8 + 1) * iVar5 * 2 + 2;
        iVar22 = iVar5 * iVar8 * 2;
        iVar41 = ((iVar19 * 2 + 1) * iVar8 + 1) * iVar7 * 2 + 2;
        iVar42 = iVar7 * iVar8;
        uVar37 = 2;
        do {
          if (0 < iVar8) {
            uVar29 = 1;
            iVar45 = iVar41;
            iVar49 = iVar40;
            do {
              lVar44 = lVar20 + 1;
              iVar17 = iVar49;
              iVar39 = iVar45;
              if (bVar13) {
                do {
                  cc[(long)iVar33 + (long)(iVar17 + 1)] = ch[(long)iVar6 + (long)(iVar39 + 1)];
                  cc[(long)iVar33 + (long)iVar17 + 2] = ch[(long)iVar6 + (long)iVar39 + 2];
                  bVar12 = lVar44 <= lVar18;
                  if (iVar9 < 0) {
                    bVar12 = iVar10 < lVar44;
                  }
                  lVar44 = lVar44 + lVar20;
                  iVar17 = iVar17 + iVar9 * 2;
                  iVar39 = iVar39 + iVar32 * 2;
                } while (bVar12);
              }
              uVar29 = uVar29 + 1;
              iVar49 = iVar49 + iVar11;
              iVar45 = iVar45 + iVar7 * 2;
            } while (uVar29 != iVar8 + 1);
          }
          uVar37 = uVar37 + 1;
          iVar40 = iVar40 + iVar22;
          iVar41 = iVar41 + iVar42 * iVar19 * 2;
        } while (uVar37 != uVar14);
        if (1 < (int)uVar4) {
          bVar13 = -1 < iVar10;
          if (iVar9 < 0) {
            bVar13 = iVar10 < 1;
          }
          iVar40 = iVar5 * ((uVar4 * 2 + 2) * iVar8 + 1) * 2 + 2;
          local_17c = iVar7 * ((iVar19 * 2 + 2) * iVar8 + 1) * 2 + 2;
          local_118 = 2;
          do {
            if (1 < iVar19) {
              lVar44 = (uVar15 + local_118 + -1) * lVar36;
              lVar52 = ((long)(int)(uVar15 * 2) + local_118 + -1) * lVar36;
              uVar37 = 2;
              iVar41 = local_17c;
              iVar45 = iVar40;
              do {
                if (0 < iVar8) {
                  uVar29 = 1;
                  iVar49 = iVar41;
                  iVar17 = iVar45;
                  do {
                    lVar26 = lVar20 + 1;
                    iVar39 = iVar49;
                    iVar50 = iVar17;
                    if (bVar13) {
                      do {
                        cc[(long)iVar33 + (long)(iVar50 + 1)] =
                             wa[(long)(int)uVar21 + lVar44 + uVar37] *
                             ch[(long)iVar6 + (long)(iVar39 + 1)] -
                             ch[(long)iVar6 + (long)iVar39 + 2] *
                             wa[(long)(int)uVar21 + lVar52 + uVar37];
                        bVar12 = lVar26 <= lVar18;
                        if (iVar9 < 0) {
                          bVar12 = iVar10 < lVar26;
                        }
                        cc[(long)iVar33 + (long)iVar50 + 2] =
                             wa[(long)(int)uVar21 + lVar44 + uVar37] *
                             ch[(long)iVar6 + (long)iVar39 + 2] +
                             wa[(long)(int)uVar21 + lVar52 + uVar37] *
                             ch[(long)iVar6 + (long)(iVar39 + 1)];
                        lVar26 = lVar26 + lVar20;
                        iVar39 = iVar39 + iVar32 * 2;
                        iVar50 = iVar50 + iVar9 * 2;
                      } while (bVar12);
                    }
                    uVar29 = uVar29 + 1;
                    iVar17 = iVar17 + iVar11;
                    iVar49 = iVar49 + iVar7 * 2;
                  } while (uVar29 != iVar8 + 1);
                }
                uVar37 = uVar37 + 1;
                iVar45 = iVar45 + iVar5 * iVar8 * uVar4 * 2;
                iVar41 = iVar41 + iVar42 * 2;
              } while (uVar37 != uVar48);
            }
            local_118 = local_118 + 1;
            iVar40 = iVar40 + iVar22;
            local_17c = local_17c + iVar42 * iVar19 * 2;
          } while (local_118 != uVar14);
        }
      }
    }
  }
  return 0;
}

Assistant:

int cmfgkb_(int *lot, int *ido, int *ip, int
	*l1, int *lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *im1,
	int *in1, fft_real_t *ch, fft_real_t *ch1, int *im2, int *in2, fft_real_t *
	wa)
{
    /* System generated locals */
    int ch_dim2, ch_dim3, ch_dim4, ch_offset, cc_dim2, cc_dim3, cc_dim4,
	    cc_offset, cc1_dim2, cc1_dim3, cc1_offset, ch1_dim2, ch1_dim3,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3, i__4,
	    i__5;

    /* Local variables */
     int i__, j, k, l, m1, m2, jc, lc, ki, m1d, m2s;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim2 = *in1;
    cc1_dim3 = *lid;
    cc1_offset = 1 + 2 * (1 + cc1_dim2 * (1 + cc1_dim3));
    cc1 -= cc1_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ip;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch1_dim2 = *in2;
    ch1_dim3 = *lid;
    ch1_offset = 1 + 2 * (1 + ch1_dim2 * (1 + ch1_dim3));
    ch1 -= ch1_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_dim4 = *ido;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * (1 + ch_dim4)));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L110: */
	}
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
/* L112: */
	    }
	}
/* L111: */
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__2) {
		m2 += *im2;
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 1] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 2] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L117: */
	    }
	}
/* L118: */
    }
    i__3 = ipph;
    for (l = 2; l <= i__3; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 1] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 2] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 2];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L113: */
	    }
	}
	i__4 = ipph;
	for (j = 3; j <= i__4; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__1 = *lid;
	    for (ki = 1; ki <= i__1; ++ki) {
		m2 = m2s;
		i__2 = m1d;
		i__5 = *im1;
		for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
		    m2 += *im2;
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 1];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 1];
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 2];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 2];
/* L114: */
		}
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    i__5 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__5 : m1 <= i__5; m1 += i__2) {
		chold1 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			- cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		chold2 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			+ cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] = chold1;
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] += cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1] = chold2;
/* L119: */
	    }
	}
/* L120: */
    }
    return 0;
L136:
    i__3 = *lid;
    for (ki = 1; ki <= i__3; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__5 = *im1;
	for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L137: */
	}
    }
    i__5 = ipph;
    for (j = 2; j <= i__5; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
/* L134: */
	    }
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__5 = *ido;
    for (i__ = 1; i__ <= i__5; ++i__) {
	i__4 = *l1;
	for (k = 1; k <= i__4; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__2) {
		m2 += *im2;
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 1] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 1];
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 2] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 2];
/* L130: */
	    }
	}
/* L131: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 1] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 1];
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 2] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 2];
/* L122: */
	    }
	}
/* L123: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__4 = *ido;
	for (i__ = 2; i__ <= i__4; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		m2 = m2s;
		i__2 = m1d;
		i__1 = *im1;
		for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
		    m2 += *im2;
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 1] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 1] - wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 2];
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 2] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 2] + wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 1];
/* L124: */
		}
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}